

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_ref_test.c
# Opt level: O2

int main(void)

{
  undefined4 uVar1;
  int iVar2;
  char *pcVar3;
  MppEncRefCfg ref;
  MppEncRefLtFrmCfg lt_ref [4];
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined4 local_160;
  undefined8 local_15c;
  undefined8 uStack_154;
  undefined8 local_14c;
  undefined8 uStack_144;
  undefined8 local_13c;
  undefined8 local_134;
  undefined8 uStack_12c;
  undefined8 local_124;
  undefined8 uStack_11c;
  undefined8 local_114;
  undefined8 local_10c;
  undefined8 uStack_104;
  undefined8 local_fc;
  undefined8 uStack_f4;
  undefined8 local_ec;
  undefined8 local_e4;
  undefined8 uStack_dc;
  undefined4 local_d4;
  undefined8 local_d0;
  undefined4 local_c8 [38];
  
  ref = (MppEncRefCfg)0x0;
  lt_ref[0].lt_idx = 0;
  lt_ref[0].temporal_id = 0;
  lt_ref[0].ref_mode = REF_MODE_GLOBAL;
  lt_ref[0].ref_arg = 0;
  lt_ref[0].lt_gap = 0;
  lt_ref[0].lt_delay = 0;
  lt_ref[1].lt_idx = 0;
  lt_ref[1].temporal_id = 0;
  lt_ref[1].ref_mode = REF_MODE_GLOBAL;
  lt_ref[1].ref_arg = 0;
  lt_ref[1].lt_gap = 0;
  lt_ref[1].lt_delay = 0;
  lt_ref[2].lt_idx = 0;
  lt_ref[2].temporal_id = 0;
  lt_ref[2].ref_mode = REF_MODE_GLOBAL;
  lt_ref[2].ref_arg = 0;
  lt_ref[2].lt_gap = 0;
  lt_ref[2].lt_delay = 0;
  lt_ref[3].lt_idx = 0;
  lt_ref[3].temporal_id = 0;
  lt_ref[3].ref_mode = REF_MODE_GLOBAL;
  lt_ref[3].ref_arg = 0;
  lt_ref[3].lt_gap = 0;
  lt_ref[3].lt_delay = 0;
  memset(local_c8,0,0x90);
  _mpp_log_l(4,"mpp_enc_ref_test","mpp_enc_ref_test start\n",0);
  mpp_enc_ref_cfg_init(&ref);
  _mpp_log_l(4,"mpp_enc_ref_test","mpp_enc_ref_test tsvc4 ref info generation start\n",0);
  mpp_enc_ref_cfg_set_cfg_cnt(ref,1,9);
  lt_ref[0].lt_idx = 0;
  lt_ref[0].temporal_id = 0;
  lt_ref[0].ref_mode = REF_TO_PREV_LT_REF;
  lt_ref[0].lt_gap = 8;
  lt_ref[0].lt_delay = 0;
  mpp_enc_ref_cfg_add_lt_cfg(ref,1,lt_ref);
  local_178 = 0;
  uStack_170 = 4;
  local_168 = 0x100000000;
  local_160 = 3;
  local_15c = 0;
  uStack_154 = 0;
  local_14c = 2;
  uStack_144 = 0;
  local_13c = 0x300000001;
  local_134 = 0;
  uStack_12c = 0;
  local_124 = 1;
  uStack_11c = 0;
  local_114 = 0x300000001;
  local_10c = 0;
  uStack_104 = 0;
  local_fc = 2;
  uStack_f4 = 0;
  local_ec = 0x300000001;
  local_e4 = 0;
  uStack_dc = 0;
  local_d4 = 0;
  local_d0 = 4;
  local_c8[0] = 0;
  mpp_enc_ref_cfg_add_st_cfg(ref,9,&local_178);
  _mpp_log_l(4,"mpp_enc_ref_test","mpp_enc_ref_test tsvc4 ref info verification start\n",0);
  uVar1 = mpp_enc_ref_cfg_check(ref);
  _mpp_log_l(4,"mpp_enc_ref_test","mpp_enc_ref_test tsvc4 ref info verification ret %d\n",0,uVar1);
  mpp_enc_ref_cfg_show(ref);
  iVar2 = mpp_enc_ref_cfg_reset(ref);
  pcVar3 = "failed";
  if (iVar2 == 0) {
    pcVar3 = "success";
  }
  _mpp_log_l(4,"mpp_enc_ref_test","mpp_enc_ref_test %s\n",0,pcVar3);
  return iVar2;
}

Assistant:

int main()
{
    MPP_RET ret = MPP_OK;
    RK_S32 lt_cnt = 0;
    RK_S32 st_cnt = 0;
    MppEncRefCfg ref = NULL;
    MppEncRefLtFrmCfg lt_ref[4];
    MppEncRefStFrmCfg st_ref[16];

    memset(&lt_ref, 0, sizeof(lt_ref));
    memset(&st_ref, 0, sizeof(st_ref));

    mpp_log("mpp_enc_ref_test start\n");

    ret = mpp_enc_ref_cfg_init(&ref);

    mpp_log("mpp_enc_ref_test tsvc4 ref info generation start\n");

    lt_cnt = 1;
    st_cnt = 9;

    ret = mpp_enc_ref_cfg_set_cfg_cnt(ref, lt_cnt, st_cnt);

    /* set 8 frame lt-ref gap */
    lt_ref[0].lt_idx        = 0;
    lt_ref[0].temporal_id   = 0;
    lt_ref[0].ref_mode      = REF_TO_PREV_LT_REF;
    lt_ref[0].lt_gap        = 8;
    lt_ref[0].lt_delay      = 0;

    ret = mpp_enc_ref_cfg_add_lt_cfg(ref, 1, lt_ref);

    /* set tsvc4 st-ref struct */
    /* st 0 layer 0 - ref */
    st_ref[0].is_non_ref    = 0;
    st_ref[0].temporal_id   = 0;
    st_ref[0].ref_mode      = REF_TO_TEMPORAL_LAYER;
    st_ref[0].ref_arg       = 0;
    st_ref[0].repeat        = 0;
    /* st 1 layer 3 - non-ref */
    st_ref[1].is_non_ref    = 1;
    st_ref[1].temporal_id   = 3;
    st_ref[1].ref_mode      = REF_TO_PREV_REF_FRM;
    st_ref[1].ref_arg       = 0;
    st_ref[1].repeat        = 0;
    /* st 2 layer 2 - ref */
    st_ref[2].is_non_ref    = 0;
    st_ref[2].temporal_id   = 2;
    st_ref[2].ref_mode      = REF_TO_PREV_REF_FRM;
    st_ref[2].ref_arg       = 0;
    st_ref[2].repeat        = 0;
    /* st 3 layer 3 - non-ref */
    st_ref[3].is_non_ref    = 1;
    st_ref[3].temporal_id   = 3;
    st_ref[3].ref_mode      = REF_TO_PREV_REF_FRM;
    st_ref[3].ref_arg       = 0;
    st_ref[3].repeat        = 0;
    /* st 4 layer 1 - ref */
    st_ref[4].is_non_ref    = 0;
    st_ref[4].temporal_id   = 1;
    st_ref[4].ref_mode      = REF_TO_PREV_REF_FRM;
    st_ref[4].ref_arg       = 0;
    st_ref[4].repeat        = 0;
    /* st 5 layer 3 - non-ref */
    st_ref[5].is_non_ref    = 1;
    st_ref[5].temporal_id   = 3;
    st_ref[5].ref_mode      = REF_TO_PREV_REF_FRM;
    st_ref[5].ref_arg       = 0;
    st_ref[5].repeat        = 0;
    /* st 6 layer 2 - ref */
    st_ref[6].is_non_ref    = 0;
    st_ref[6].temporal_id   = 2;
    st_ref[6].ref_mode      = REF_TO_PREV_REF_FRM;
    st_ref[6].ref_arg       = 0;
    st_ref[6].repeat        = 0;
    /* st 7 layer 3 - non-ref */
    st_ref[7].is_non_ref    = 1;
    st_ref[7].temporal_id   = 3;
    st_ref[7].ref_mode      = REF_TO_PREV_REF_FRM;
    st_ref[7].ref_arg       = 0;
    st_ref[7].repeat        = 0;
    /* st 8 layer 0 - ref */
    st_ref[8].is_non_ref    = 0;
    st_ref[8].temporal_id   = 0;
    st_ref[8].ref_mode      = REF_TO_TEMPORAL_LAYER;
    st_ref[8].ref_arg       = 0;
    st_ref[8].repeat        = 0;

    ret = mpp_enc_ref_cfg_add_st_cfg(ref, 9, st_ref);

    /* check and get dpb size */
    mpp_log("mpp_enc_ref_test tsvc4 ref info verification start\n");
    ret = mpp_enc_ref_cfg_check(ref);
    mpp_log("mpp_enc_ref_test tsvc4 ref info verification ret %d\n", ret);

    ret = mpp_enc_ref_cfg_show(ref);

    /* reset for next config */
    ret = mpp_enc_ref_cfg_reset(ref);

#if 0
    mpp_log("mpp_enc_ref_test smartp ref info generation start\n");

    /* typical smartp config */
    lt_cnt = 1;
    st_cnt = 3;

    ret = mpp_enc_ref_cfg_set_cfg_cnt(ref, lt_cnt, st_cnt);

    memset(&lt_ref, 0, sizeof(lt_ref));
    memset(&st_ref, 0, sizeof(st_ref));

    /* set 300 frame lt-ref gap */
    lt_ref[0].lt_idx        = 0;
    lt_ref[0].temporal_id   = 0;
    lt_ref[0].ref_mode      = REF_TO_PREV_INTRA;
    lt_ref[0].lt_gap        = 300;
    lt_ref[0].lt_delay      = 0;

    ret = mpp_enc_ref_cfg_add_lt_cfg(ref, 1, lt_ref);

    st_ref[0].is_non_ref    = 0;
    st_ref[0].temporal_id   = 0;
    st_ref[0].ref_mode      = REF_TO_PREV_LT_REF;
    st_ref[0].ref_arg       = 0;
    st_ref[0].repeat        = 0;

    st_ref[1].is_non_ref    = 0;
    st_ref[1].temporal_id   = 0;
    st_ref[1].ref_mode      = REF_TO_PREV_REF_FRM;
    st_ref[1].ref_arg       = 0;
    st_ref[1].repeat        = 299;

    st_ref[2].is_non_ref    = 0;
    st_ref[2].temporal_id   = 0;
    st_ref[2].ref_mode      = REF_TO_PREV_LT_REF;
    st_ref[2].ref_arg       = 0;
    st_ref[2].repeat        = 0;

    ret = mpp_enc_ref_cfg_add_st_cfg(ref, 3, st_ref);

    mpp_log("mpp_enc_ref_test smartp ref info verification start\n");
    ret = mpp_enc_ref_cfg_check(ref);
    mpp_log("mpp_enc_ref_test smartp ref info verification ret %d\n", ret);

    ret = mpp_enc_ref_cfg_deinit(&ref);
#endif

    mpp_log("mpp_enc_ref_test %s\n", ret ? "failed" : "success");

    return ret;
}